

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O0

Type * QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_library_settings>_>::
       instance(void)

{
  int iVar1;
  PlainType *pPVar2;
  
  if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_library_settings>>::
      instance()::holder == '\0') {
    iVar1 = __cxa_guard_acquire(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_library_settings>>
                                 ::instance()::holder);
    if (iVar1 != 0) {
      QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_library_settings>::Holder
                ((Holder<(anonymous_namespace)::Q_QGS_qt_library_settings> *)0x23b0ea);
      __cxa_atexit(QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_library_settings>::~Holder
                   ,&instance::holder,&__dso_handle);
      __cxa_guard_release(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_library_settings>>
                           ::instance()::holder);
    }
  }
  pPVar2 = QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_library_settings>::pointer
                     ((Holder<(anonymous_namespace)::Q_QGS_qt_library_settings> *)
                      &instance::holder.storage);
  return pPVar2;
}

Assistant:

static Type *instance() noexcept(Holder::ConstructionIsNoexcept)
    {
        static Holder holder;
        return holder.pointer();
    }